

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O1

edata_t * sec_alloc(tsdn_t *tsdn,pai_t *self,size_t size,size_t alignment,_Bool zero,_Bool guarded,
                   _Bool frequent_reuse,_Bool *deferred_work_generated)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  edata_t *peVar3;
  anon_struct_8_1_803fbc3e_for_head aVar4;
  bool bVar5;
  edata_list_active_t eVar6;
  edata_t *peVar7;
  ulong uVar8;
  sec_shard_t *shard;
  byte bVar9;
  uint uVar10;
  sec_bin_t *psVar11;
  long lVar12;
  _func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *p_Var13;
  int iVar14;
  pthread_mutex_t *__mutex;
  mutex_prof_data_t *data;
  undefined1 local_49;
  edata_list_active_t result;
  
  if (((0x1000 < alignment || zero) ||
      (self[1].alloc_batch ==
       (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr *)
       0x0)) || (self[1].expand < size)) {
    peVar7 = (edata_t *)
             (**(code **)self[1].alloc)
                       (tsdn,self[1].alloc,size,alignment,zero,0,frequent_reuse,
                        deferred_work_generated);
    return peVar7;
  }
  if (size < 0x7000000000000001) {
    uVar8 = size - 1;
    if (uVar8 == 0) {
      uVar10 = 0x40;
    }
    else {
      lVar12 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      uVar10 = (uint)lVar12 ^ 0x3f;
    }
    iVar14 = 0x32 - uVar10;
    if (0x32 < uVar10) {
      iVar14 = 0;
    }
    bVar9 = 0xc;
    if (0x4000 < size) {
      bVar9 = (char)iVar14 + 0xb;
    }
    uVar8 = (ulong)(((uint)(uVar8 >> (bVar9 & 0x3f)) & 3) + iVar14 * 4);
  }
  else {
    uVar8 = 199;
  }
  shard = sec_shard_pick(tsdn,(sec_t *)self);
  psVar11 = shard->bins + uVar8;
  __mutex = (pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48);
  iVar14 = pthread_mutex_trylock(__mutex);
  if (iVar14 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&shard->mtx);
    (shard->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(shard->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((shard->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (shard->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(shard->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (shard->enabled == true) {
    peVar7 = (psVar11->freelist).head.qlh_first;
    if (peVar7 != (edata_t *)0x0) {
      peVar3 = (peVar7->field_5).ql_link_active.qre_next;
      (psVar11->freelist).head.qlh_first = peVar3;
      if (peVar3 == peVar7) {
        (psVar11->freelist).head.qlh_first = (edata_t *)0x0;
      }
      else {
        (((peVar7->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
             (((peVar7->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev;
        (((peVar7->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev =
             (peVar7->field_5).ql_link_active.qre_prev;
        peVar3 = (peVar7->field_5).ql_link_active.qre_next;
        (peVar7->field_5).ql_link_active.qre_prev =
             (((peVar7->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
        (((peVar3->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar3;
        (((peVar7->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar7;
      }
      psVar11->bytes_cur = psVar11->bytes_cur - ((peVar7->field_2).e_size_esn & 0xfffffffffffff000);
      shard->bytes_cur = shard->bytes_cur - ((peVar7->field_2).e_size_esn & 0xfffffffffffff000);
    }
  }
  else {
    peVar7 = (edata_t *)0x0;
  }
  if (((peVar7 == (edata_t *)0x0) && (psVar11->being_batch_filled == false)) &&
     (self[1].dalloc_batch !=
      (_func_void_tsdn_t_ptr_pai_t_ptr_edata_list_active_t_ptr__Bool_ptr *)0x0)) {
    psVar11->being_batch_filled = true;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  if (peVar7 != (edata_t *)0x0) {
    return peVar7;
  }
  if (!bVar5) {
    peVar7 = (edata_t *)(**(code **)self[1].alloc)(tsdn,self[1].alloc,size,alignment,0,0);
    return peVar7;
  }
  result.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
  local_49 = 0;
  uVar8 = (**(code **)(self[1].alloc + 8))
                    (tsdn,self[1].alloc,size,self[1].dalloc_batch + 1,&result,frequent_reuse,
                     &local_49);
  eVar6 = result;
  if (result.head.qlh_first != (edata_t *)0x0) {
    aVar4.qlh_first = *(edata_t **)((long)result.head.qlh_first + 0x28);
    if ((anon_struct_8_1_803fbc3e_for_head)aVar4.qlh_first == result.head.qlh_first) {
      result.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
    }
    else {
      *(edata_t **)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28) =
           ((aVar4.qlh_first)->field_5).ql_link_active.qre_prev;
      *(undefined8 *)(*(long *)((long)result.head.qlh_first + 0x28) + 0x30) =
           *(undefined8 *)((long)result.head.qlh_first + 0x30);
      *(undefined8 *)((long)result.head.qlh_first + 0x30) =
           *(undefined8 *)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28);
      *(long *)(*(long *)(*(long *)((long)result.head.qlh_first + 0x28) + 0x30) + 0x28) =
           *(long *)((long)result.head.qlh_first + 0x28);
      ((anon_struct_8_1_803fbc3e_for_head *)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28))
      ->qlh_first = (edata_t *)result.head.qlh_first;
      result.head.qlh_first =
           (anon_struct_8_1_803fbc3e_for_head)(anon_struct_8_1_803fbc3e_for_head)aVar4.qlh_first;
    }
  }
  iVar14 = pthread_mutex_trylock(__mutex);
  if (iVar14 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&shard->mtx);
    (shard->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(shard->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((shard->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (shard->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(shard->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  psVar11->being_batch_filled = false;
  if (uVar8 < 2) goto LAB_01c92862;
  lVar12 = (uVar8 - 1) * size;
  peVar7 = (psVar11->freelist).head.qlh_first;
  if (peVar7 == (edata_t *)0x0) {
    (psVar11->freelist).head.qlh_first = (edata_t *)result.head.qlh_first;
LAB_01c9282a:
    result.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
  }
  else if (result.head.qlh_first != (edata_t *)0x0) {
    *(edata_t **)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28) =
         (peVar7->field_5).ql_link_active.qre_prev;
    (((psVar11->freelist).head.qlh_first)->field_5).ql_link_active.qre_prev =
         *(edata_t **)((long)result.head.qlh_first + 0x30);
    *(undefined8 *)((long)result.head.qlh_first + 0x30) =
         *(undefined8 *)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28);
    peVar7 = (psVar11->freelist).head.qlh_first;
    (((peVar7->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar7;
    ((anon_struct_8_1_803fbc3e_for_head *)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28))->
    qlh_first = (edata_t *)result.head.qlh_first;
    goto LAB_01c9282a;
  }
  psVar11->bytes_cur = psVar11->bytes_cur + lVar12;
  p_Var13 = (_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *)
            (lVar12 + shard->bytes_cur);
  shard->bytes_cur = (size_t)p_Var13;
  if (self[1].shrink < p_Var13) {
    sec_flush_some_and_unlock(tsdn,(sec_t *)self,shard);
    return (edata_t *)eVar6.head.qlh_first;
  }
LAB_01c92862:
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return eVar6.head.qlh_first.qlh_first;
}

Assistant:

static edata_t *
sec_alloc(tsdn_t *tsdn, pai_t *self, size_t size, size_t alignment, bool zero,
    bool guarded, bool frequent_reuse, bool *deferred_work_generated) {
	assert((size & PAGE_MASK) == 0);
	assert(!guarded);

	sec_t *sec = (sec_t *)self;

	if (zero || alignment > PAGE || sec->opts.nshards == 0
	    || size > sec->opts.max_alloc) {
		return pai_alloc(tsdn, sec->fallback, size, alignment, zero,
		    /* guarded */ false, frequent_reuse,
		    deferred_work_generated);
	}
	pszind_t pszind = sz_psz2ind(size);
	assert(pszind < sec->npsizes);

	sec_shard_t *shard = sec_shard_pick(tsdn, sec);
	sec_bin_t *bin = &shard->bins[pszind];
	bool do_batch_fill = false;

	malloc_mutex_lock(tsdn, &shard->mtx);
	edata_t *edata = sec_shard_alloc_locked(tsdn, sec, shard, bin);
	if (edata == NULL) {
		if (!bin->being_batch_filled
		    && sec->opts.batch_fill_extra > 0) {
			bin->being_batch_filled = true;
			do_batch_fill = true;
		}
	}
	malloc_mutex_unlock(tsdn, &shard->mtx);
	if (edata == NULL) {
		if (do_batch_fill) {
			edata = sec_batch_fill_and_alloc(tsdn, sec, shard, bin,
			    size, frequent_reuse);
		} else {
			edata = pai_alloc(tsdn, sec->fallback, size, alignment,
			    zero, /* guarded */ false, frequent_reuse,
			    deferred_work_generated);
		}
	}
	return edata;
}